

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O0

acmod_id_t
acmod_set_tri2id(acmod_set_t *acmod_set,acmod_id_t phone,acmod_id_t left_context,
                acmod_id_t right_context,word_posn_t posn)

{
  cell_index_t i;
  itree_t *idx;
  word_posn_t posn_local;
  acmod_id_t right_context_local;
  acmod_id_t left_context_local;
  acmod_id_t phone_local;
  acmod_set_t *acmod_set_local;
  
  if (acmod_set->n_multi == 0) {
    acmod_set_local._4_4_ = 0xffffffff;
  }
  else {
    acmod_set_local._4_4_ =
         itree_find_tri(acmod_set->multi_idx[phone],left_context,right_context,posn);
    if (acmod_set_local._4_4_ == 0xffffffff) {
      acmod_set_local._4_4_ = 0xffffffff;
    }
  }
  return acmod_set_local._4_4_;
}

Assistant:

acmod_id_t
acmod_set_tri2id(acmod_set_t *acmod_set,
		 acmod_id_t phone,
		 acmod_id_t left_context,
		 acmod_id_t right_context,
		 word_posn_t posn)
{
    itree_t *idx;
    cell_index_t i;

    if (acmod_set->n_multi == 0) {
	/* none defined */

	return NO_ACMOD;
    }

    idx = acmod_set->multi_idx[phone];

    i = itree_find_tri(idx, left_context, right_context, posn);

    if (i != NULL_INDEX)
	return i;
    else
	return NO_ACMOD;
}